

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O1

void __thiscall HighsMipSolverData::runSetup(HighsMipSolverData *this)

{
  vector<double,_std::allocator<double>_> *Avalue;
  HighsDomain *globaldom;
  Highs *this_00;
  HighsInt HVar1;
  uint uVar2;
  pointer pdVar3;
  HighsOptions *pHVar4;
  HighsCallback *this_01;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer piVar9;
  HighsInt *pHVar10;
  int *piVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  int *piVar18;
  logic_error *this_02;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  HighsLp *pHVar22;
  uint uVar23;
  pointer piVar24;
  HighsInt *pHVar25;
  int iVar26;
  double *pdVar27;
  iterator iVar28;
  double *pdVar29;
  vector<int,std::allocator<int>> *this_03;
  HighsLp *pHVar30;
  HighsMipSolver *pHVar31;
  byte bVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  double dVar35;
  double dVar36;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  _Base_ptr local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  pointer piStack_1a0;
  pointer local_198;
  pointer local_190;
  pointer piStack_188;
  pointer local_180;
  pointer local_178;
  pointer pdStack_170;
  pointer local_168;
  pointer local_160;
  pointer pdStack_158;
  pointer local_150;
  pointer local_148;
  pointer piStack_140;
  pointer local_138;
  pointer local_130;
  pointer piStack_128;
  pointer local_120;
  pointer local_118;
  pointer piStack_110;
  pointer local_108;
  pointer local_100;
  pointer piStack_f8;
  pointer local_f0;
  pointer local_e8;
  pointer pdStack_e0;
  pointer local_d8;
  pointer local_d0;
  pointer pdStack_c8;
  pointer local_c0;
  double local_b8 [9];
  vector<int,_std::allocator<int>_> *local_70;
  string local_68;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  local_48;
  
  bVar32 = 0;
  pHVar31 = this->mipsolver;
  pHVar22 = pHVar31->model_;
  *(undefined4 *)&this->disptime = 0;
  *(undefined4 *)((long)&this->disptime + 4) = 0;
  *(undefined4 *)&this->last_disptime = 0;
  *(undefined4 *)((long)&this->last_disptime + 4) = 0xfff00000;
  dVar35 = pHVar22->offset_;
  dVar36 = this->upper_limit - dVar35;
  dVar14 = this->optimality_limit - dVar35;
  auVar12._8_4_ = SUB84(dVar14,0);
  auVar12._0_8_ = dVar36;
  auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
  this->upper_limit = dVar36;
  this->optimality_limit = (double)auVar12._8_8_;
  dVar36 = this->lower_bound - dVar35;
  dVar35 = this->upper_bound - dVar35;
  auVar13._8_4_ = SUB84(dVar35,0);
  auVar13._0_8_ = dVar36;
  auVar13._12_4_ = (int)((ulong)dVar35 >> 0x20);
  this->lower_bound = dVar36;
  this->upper_bound = (double)auVar13._8_8_;
  if (pHVar31->solution_objective_ < INFINITY) {
    presolve::HighsPostsolveStack::getReducedPrimalSolution
              ((vector<double,_std::allocator<double>_> *)local_1d8,&this->postSolveStack,
               &pHVar31->solution_);
    pdVar3 = (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._0_8_;
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    local_1c8._0_8_ = (pointer)0x0;
    if (pdVar3 != (pointer)0x0) {
      operator_delete(pdVar3);
    }
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_);
    }
    pHVar31 = this->mipsolver;
    dVar35 = (pHVar31->options_mip_->super_HighsOptionsStruct).mip_feasibility_tolerance;
    if ((dVar35 < pHVar31->bound_violation_) || (dVar35 < pHVar31->integrality_violation_)) {
      bVar15 = false;
    }
    else {
      bVar15 = pHVar31->row_violation_ <= dVar35;
    }
    dVar35 = (double)pHVar31->orig_model_->sense_ * pHVar31->solution_objective_ -
             pHVar31->model_->offset_;
    if (this->numRestarts == 0) {
      pcVar19 = "infeasible";
      if (bVar15) {
        pcVar19 = "feasible";
      }
      highsLogUser(&(pHVar31->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",pcVar19);
    }
    if ((bVar15) && (dVar36 = this->upper_bound, dVar35 < dVar36)) {
      this->upper_bound = dVar35;
      if (this->mipsolver->submip == false) {
        if ((dVar35 != dVar36) || (NAN(dVar35) || NAN(dVar36))) {
          updatePrimalDualIntegral
                    (this,this->lower_bound,this->lower_bound,dVar36,dVar35,false,false);
        }
      }
      dVar36 = computeNewUpperLimit(this,dVar35,0.0,0.0);
      saveReportMipSolution(this,dVar36);
      if (dVar36 < this->upper_limit) {
        this->upper_limit = dVar36;
        pHVar4 = this->mipsolver->options_mip_;
        dVar35 = computeNewUpperLimit
                           (this,dVar35,(pHVar4->super_HighsOptionsStruct).mip_abs_gap,
                            (pHVar4->super_HighsOptionsStruct).mip_rel_gap);
        this->optimality_limit = dVar35;
        (this->nodequeue).optimality_limit = dVar35;
      }
    }
    if ((((this->mipsolver->submip == false) && (bVar15)) &&
        (this_01 = this->mipsolver->callback_,
        (this_01->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) &&
       ((*(this_01->active).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 8) != 0)) {
      HighsCallback::clearHighsCallbackDataOut(this_01);
      pHVar31 = this->mipsolver;
      (pHVar31->callback_->data_out).mip_solution =
           (pHVar31->solution_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      dVar35 = pHVar31->solution_objective_;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Feasible solution","");
      interruptFromCallbackWithData(this,3,dVar35,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  if (this->mipsolver->model_->num_col_ == 0) {
    local_1d8._0_8_ = (pointer)0x0;
    local_1d8._8_8_ = (pointer)0x0;
    local_1c8._0_8_ = (pointer)0x0;
    addIncumbent(this,(vector<double,_std::allocator<double>_> *)local_1d8,0.0,5,true,false);
    if ((pointer)local_1d8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1d8._0_8_);
    }
  }
  local_1b8 = (_Base_ptr)0x0;
  p_Stack_1b0 = (_Base_ptr)0x0;
  local_1c8._8_8_ = (pointer)0x0;
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->redcostfixing).lurkingColUpper.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->redcostfixing).lurkingColUpper.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector(&local_48);
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->redcostfixing).lurkingColLower.
       super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8._8_8_;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1b8;
  (this->redcostfixing).lurkingColLower.
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_1b0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1b8 = (_Base_ptr)0x0;
  p_Stack_1b0 = (_Base_ptr)0x0;
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector((vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
             *)(local_1c8 + 8));
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::~vector((vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
             *)local_1d8);
  HighsPseudocost::HighsPseudocost((HighsPseudocost *)local_1d8,this->mipsolver);
  pdVar3 = (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
  (this->pseudocost).pseudocostup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_1c8._0_8_;
  local_1c8._0_8_ = (pointer)0x0;
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8._8_8_ = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  pdVar3 = (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1c8._8_8_;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_1b8;
  (this->pseudocost).pseudocostdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)p_Stack_1b0;
  local_1c8._8_8_ = (pointer)0x0;
  local_1b8 = (_Base_ptr)0x0;
  p_Stack_1b0 = (_Base_ptr)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar5 = (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1a8;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_1a0;
  (this->pseudocost).nsamplesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_198;
  local_1a8 = (_Base_ptr)0x0;
  piStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_190;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_188;
  (this->pseudocost).nsamplesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_180;
  local_190 = (pointer)0x0;
  piStack_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  pdVar3 = (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_178;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_170;
  (this->pseudocost).inferencesup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_168;
  local_178 = (pointer)0x0;
  pdStack_170 = (pointer)0x0;
  local_168 = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  pdVar3 = (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_160;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_158;
  (this->pseudocost).inferencesdown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_150;
  local_160 = (pointer)0x0;
  pdStack_158 = (pointer)0x0;
  local_150 = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  piVar5 = (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_148;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_140;
  (this->pseudocost).ninferencesup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_138;
  local_148 = (pointer)0x0;
  piStack_140 = (pointer)0x0;
  local_138 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_130;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_128;
  (this->pseudocost).ninferencesdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_120;
  local_130 = (pointer)0x0;
  piStack_128 = (pointer)0x0;
  local_120 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_118;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_110;
  (this->pseudocost).ncutoffsup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_108;
  local_118 = (pointer)0x0;
  piStack_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  piVar5 = (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = local_100;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = piStack_f8;
  (this->pseudocost).ncutoffsdown.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_f0;
  local_100 = (pointer)0x0;
  piStack_f8 = (pointer)0x0;
  local_f0 = (pointer)0x0;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5);
  }
  pdVar3 = (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_e8;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_e0;
  (this->pseudocost).conflictscoreup.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_d8;
  local_e8 = (pointer)0x0;
  pdStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  pdVar3 = (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = local_d0;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdStack_c8;
  (this->pseudocost).conflictscoredown.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_c0;
  local_d0 = (pointer)0x0;
  pdStack_c8 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  pdVar27 = local_b8;
  pdVar29 = &(this->pseudocost).conflict_weight;
  for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
    *pdVar29 = *pdVar27;
    pdVar27 = pdVar27 + (ulong)bVar32 * -2 + 1;
    pdVar29 = pdVar29 + (ulong)bVar32 * -2 + 1;
  }
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)local_1d8);
  HighsNodeQueue::setNumCol(&this->nodequeue,this->mipsolver->model_->num_col_);
  (this->nodequeue).optimality_limit = this->optimality_limit;
  piVar5 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  piVar5 = (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  this->rowMatrixSet = true;
  Avalue = &(pHVar22->a_matrix_).value_;
  local_70 = &this->ARstart_;
  highsSparseTranspose
            (pHVar22->num_row_,pHVar22->num_col_,&(pHVar22->a_matrix_).start_,
             &(pHVar22->a_matrix_).index_,Avalue,local_70,&this->ARindex_,&this->ARvalue_);
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->uplocks,(long)pHVar22->num_col_,(value_type_conflict2 *)local_1d8);
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->downlocks,(long)pHVar22->num_col_,(value_type_conflict2 *)local_1d8);
  if (pHVar22->num_col_ != 0) {
    piVar5 = (pHVar22->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar21 = 0;
    do {
      iVar16 = piVar5[uVar21];
      lVar20 = (long)iVar16;
      iVar26 = piVar5[uVar21 + 1];
      if (iVar26 != iVar16) {
        piVar6 = (pHVar22->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (pHVar22->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (pHVar22->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->downlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->uplocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar26 = iVar26 - iVar16;
        do {
          iVar16 = piVar6[lVar20];
          if (-INFINITY < pdVar3[iVar16]) {
            pdVar27 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar20;
            piVar24 = piVar8;
            if (*pdVar27 <= 0.0 && *pdVar27 != 0.0) {
              piVar24 = piVar9;
            }
            piVar24[uVar21] = piVar24[uVar21] + 1;
          }
          if (pdVar7[iVar16] < INFINITY) {
            pdVar27 = (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar20;
            piVar24 = piVar9;
            if (*pdVar27 <= 0.0 && *pdVar27 != 0.0) {
              piVar24 = piVar8;
            }
            piVar24[uVar21] = piVar24[uVar21] + 1;
          }
          lVar20 = lVar20 + 1;
          iVar26 = iVar26 + -1;
        } while (iVar26 != 0);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)pHVar22->num_col_);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->rowintegral,(long)this->mipsolver->model_->num_row_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->maxAbsRowCoef,(long)this->mipsolver->model_->num_row_);
  pHVar30 = this->mipsolver->model_;
  if (pHVar30->num_row_ != 0) {
    uVar21 = 0;
    do {
      piVar5 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = piVar5[uVar21];
      iVar26 = piVar5[uVar21 + 1];
      if (iVar26 == iVar16) {
        bVar15 = true;
        dVar36 = 0.0;
      }
      else {
        dVar35 = this->epsilon;
        pdVar3 = (this->ARvalue_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this->ARindex_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar33 = 0;
        uVar34 = 0;
        bVar15 = true;
        lVar20 = 0;
        do {
          if ((bVar15) &&
             ((pHVar30->integrality_).
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[piVar5[iVar16 + lVar20]] != kContinuous)) {
            dVar36 = pdVar3[iVar16 + lVar20];
            dVar14 = round(dVar36);
            bVar15 = ABS(dVar36 - dVar14) <= dVar35;
          }
          else {
            bVar15 = false;
          }
          dVar36 = ABS(pdVar3[iVar16 + lVar20]);
          if (dVar36 <= (double)CONCAT44(uVar34,uVar33)) {
            dVar36 = (double)CONCAT44(uVar34,uVar33);
          }
          lVar20 = lVar20 + 1;
          uVar33 = SUB84(dVar36,0);
          uVar34 = (undefined4)((ulong)dVar36 >> 0x20);
        } while (iVar26 - iVar16 != (int)lVar20);
      }
      if (bVar15 != false) {
        pdVar3 = (this->presolvedModel).row_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar35 = pdVar3[uVar21];
        if (-INFINITY < dVar35) {
          dVar35 = ceil(dVar35 - this->feastol);
          pdVar3[uVar21] = dVar35;
        }
        pdVar3 = (this->presolvedModel).row_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar35 = pdVar3[uVar21];
        if (dVar35 < INFINITY) {
          dVar35 = floor(dVar35 + this->feastol);
          pdVar3[uVar21] = dVar35;
        }
      }
      (this->rowintegral).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21] = bVar15;
      (this->maxAbsRowCoef).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21] = dVar36;
      uVar21 = uVar21 + 1;
      pHVar30 = this->mipsolver->model_;
    } while (uVar21 != (uint)pHVar30->num_row_);
  }
  globaldom = &this->domain;
  HighsObjectiveFunction::setupCliquePartition
            (&this->objectiveFunction,globaldom,&this->cliquetable);
  HighsDomain::setupObjectivePropagation(globaldom);
  HighsDomain::computeRowActivities(globaldom);
  HighsDomain::propagate(globaldom);
  if ((this->domain).infeasible_ == false) {
    if (pHVar22->num_col_ == 0) {
      this->mipsolver->modelstatus_ = kOptimal;
    }
    else {
      bVar15 = checkLimits(this,0);
      if (!bVar15) {
        pHVar25 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar10 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (pHVar25 != pHVar10) {
          do {
            HighsImplications::cleanupVarbounds(&this->implications,*pHVar25);
            pHVar25 = pHVar25 + 1;
          } while (pHVar25 != pHVar10);
        }
        piVar11 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (piVar18 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start; piVar18 != piVar11;
            piVar18 = piVar18 + 1) {
          (globaldom->changedcolsflags_).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[*piVar18] = '\0';
        }
        piVar5 = (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar5) {
          (this->domain).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar5;
        }
        local_1d8._0_8_ = (pointer)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"presolve","");
        this_00 = &(this->lp).lpsolver;
        Highs::setOptionValue(this_00,(string *)local_1d8,&::kHighsOffString_abi_cxx11_);
        if ((pointer)local_1d8._0_8_ != (pointer)local_1c8) {
          operator_delete((void *)local_1d8._0_8_);
        }
        local_1d8._0_8_ = (pointer)local_1c8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,"simplex_initial_condition_check","");
        Highs::setOptionValue(this_00,(string *)local_1d8,false);
        if ((pointer)local_1d8._0_8_ != (pointer)local_1c8) {
          operator_delete((void *)local_1d8._0_8_);
        }
        checkObjIntegrality(this);
        pdVar3 = (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        pdVar3 = (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        uVar23 = 0;
        this->maxTreeSizeLog2 = 0;
        local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffff00000000;
        pHVar31 = this->mipsolver;
        pHVar22 = pHVar31->model_;
        if (pHVar22->num_col_ != 0) {
          uVar23 = 0;
          iVar16 = 0;
          do {
            switch((pHVar22->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar16]) {
            case kContinuous:
              dVar35 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar16];
              pdVar27 = (this->domain).col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + iVar16;
              if ((dVar35 != *pdVar27) || (NAN(dVar35) || NAN(*pdVar27))) {
                iVar28._M_current =
                     (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                this_03 = (vector<int,std::allocator<int>> *)&this->continuous_cols;
                if (iVar28._M_current ==
                    (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
LAB_002be0a3:
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_03,iVar28,(int *)local_1d8);
                }
                else {
                  *iVar28._M_current = iVar16;
                  (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current + 1;
                }
              }
              break;
            case kInteger:
              dVar35 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar16];
              pdVar27 = (this->domain).col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + iVar16;
              if ((dVar35 != *pdVar27) || (NAN(dVar35) || NAN(*pdVar27))) {
                iVar28._M_current =
                     (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar28._M_current ==
                    (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->integer_cols,iVar28,
                             (int *)local_1d8);
                }
                else {
                  *iVar28._M_current = iVar16;
                  (this->integer_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current + 1;
                }
                iVar28._M_current =
                     (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar28._M_current ==
                    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->integral_cols,iVar28,
                             (int *)local_1d8);
                }
                else {
                  *iVar28._M_current = local_1d8._0_4_;
                  (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current + 1;
                }
                pHVar22 = this->mipsolver->model_;
                dVar35 = ((pHVar22->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[(int)local_1d8._0_4_] + 1.0) -
                         (pHVar22->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)local_1d8._0_4_];
                if (1024.0 <= dVar35) {
                  dVar35 = 1024.0;
                }
                dVar35 = log2(dVar35);
                dVar35 = ceil(dVar35);
                this->maxTreeSizeLog2 = this->maxTreeSizeLog2 + (int)dVar35;
                pHVar22 = this->mipsolver->model_;
                uVar23 = uVar23 + ((pHVar22->col_upper_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)local_1d8._0_4_] == 1.0 &&
                                  (pHVar22->col_lower_).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[(int)local_1d8._0_4_] == 0.0);
              }
              else {
                dVar35 = (this->domain).col_lower_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar16];
                dVar36 = round(dVar35);
                dVar35 = ABS(dVar35 - dVar36);
                if (this->feastol <= dVar35 && dVar35 != this->feastol) {
                  pHVar31->modelstatus_ = kInfeasible;
                  uVar33 = SUB84(this->lower_bound,0);
                  uVar34 = (undefined4)((ulong)this->lower_bound >> 0x20);
                  this->lower_bound = INFINITY;
                  if (pHVar31->submip != false) goto LAB_002bdd8a;
                  goto LAB_002bdd60;
                }
              }
              break;
            case kSemiContinuous:
            case kSemiInteger:
              highsLogUser(&(pHVar31->options_mip_->super_HighsOptionsStruct).log_options,kError,
                           "Semicontinuous or semiinteger variables should have been reformulated away before HighsMipSolverData::runSetup() is called."
                          );
              this_02 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(this_02,"Unexpected variable type");
              __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            case kImplicitInteger:
              dVar35 = (this->domain).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar16];
              pdVar27 = (this->domain).col_upper_.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + iVar16;
              if ((dVar35 != *pdVar27) || (NAN(dVar35) || NAN(*pdVar27))) {
                iVar28._M_current =
                     (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar28._M_current ==
                    (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&this->implint_cols,iVar28,
                             (int *)local_1d8);
                }
                else {
                  *iVar28._M_current = iVar16;
                  (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar28._M_current + 1;
                }
                iVar28._M_current =
                     (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                this_03 = (vector<int,std::allocator<int>> *)&this->integral_cols;
                if (iVar28._M_current ==
                    (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_002be0a3;
                *iVar28._M_current = local_1d8._0_4_;
                (this->integral_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar28._M_current + 1;
              }
            }
            iVar16 = local_1d8._0_4_ + 1;
            local_1d8._0_4_ = iVar16;
            pHVar31 = this->mipsolver;
            pHVar22 = pHVar31->model_;
          } while (iVar16 != pHVar22->num_col_);
        }
        basisTransfer(this);
        iVar16 = (int)((ulong)((long)(this->integer_cols).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->integer_cols).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        this->numintegercols = iVar16;
        this->detectSymmetries = (bool)(this->detectSymmetries & 0 < (int)uVar23);
        HVar1 = (this->cliquetable).numEntries;
        this->numCliqueEntriesAfterPresolve = HVar1;
        if (this->numRestarts == 0) {
          this->numCliqueEntriesAfterFirstPresolve = HVar1;
          pcVar19 = 
          "\nSolving MIP model with:\n   %d rows\n   %d cols (%d binary, %d integer, %d implied int., %d continuous)\n   %d nonzeros\n"
          ;
        }
        else {
          pcVar19 = 
          "Model after restart has %d rows, %d cols (%d bin., %d int., %d impl., %d cont.), and %d nonzeros\n"
          ;
        }
        pHVar4 = this->mipsolver->options_mip_;
        pHVar22 = this->mipsolver->model_;
        HVar1 = pHVar22->num_col_;
        uVar2 = pHVar22->num_row_;
        piVar5 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar6 = (this->implint_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar9 = (this->continuous_cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = HighsSparseMatrix::numNz(&pHVar22->a_matrix_);
        highsLogUser(&(pHVar4->super_HighsOptionsStruct).log_options,kInfo,pcVar19,(ulong)uVar2,
                     HVar1,(ulong)uVar23,(ulong)(iVar16 - uVar23),
                     (ulong)((long)piVar5 - (long)piVar6) >> 2,
                     (ulong)((long)piVar8 - (long)piVar9) >> 2,(ulong)uVar17);
        HighsPrimalHeuristics::setupIntCols(&this->heuristics);
        if (INFINITY <= this->upper_limit) {
          this->analyticCenterComputed = false;
        }
        this->analyticCenterStatus = kMin;
        pdVar3 = (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar3) {
          (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar3;
        }
        HighsSymmetries::clear(&this->symmetries);
        if (this->numRestarts != 0) {
          highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kInfo,
                       "\n");
        }
      }
    }
  }
  else {
    pHVar31 = this->mipsolver;
    pHVar31->modelstatus_ = kInfeasible;
    uVar33 = SUB84(this->lower_bound,0);
    uVar34 = (undefined4)((ulong)this->lower_bound >> 0x20);
    this->lower_bound = INFINITY;
    if (pHVar31->submip == false) {
LAB_002bdd60:
      if ((double)CONCAT44(uVar34,uVar33) < INFINITY) {
        updatePrimalDualIntegral
                  (this,(double)CONCAT44(uVar34,uVar33),INFINITY,this->upper_bound,this->upper_bound
                   ,false,false);
      }
    }
LAB_002bdd8a:
    (this->pruned_treeweight).hi = 1.0;
    (this->pruned_treeweight).lo = 0.0;
  }
  return;
}

Assistant:

void HighsMipSolverData::runSetup() {
  const HighsLp& model = *mipsolver.model_;

  last_disptime = -kHighsInf;
  disptime = 0;

  // Transform the reference of the objective limit and lower/upper
  // bounds from the original model to the current model, undoing the
  // transformation done before restart so that the offset change due
  // to presolve is incorporated. Bound changes are transitory, so no
  // real gap change, and no update to P-D integral is necessary
  upper_limit -= mipsolver.model_->offset_;
  optimality_limit -= mipsolver.model_->offset_;

  lower_bound -= mipsolver.model_->offset_;
  upper_bound -= mipsolver.model_->offset_;

  if (mipsolver.solution_objective_ != kHighsInf) {
    incumbent = postSolveStack.getReducedPrimalSolution(mipsolver.solution_);
    // return the objective value in the transformed space
    double solobj =
        mipsolver.solution_objective_ * (int)mipsolver.orig_model_->sense_ -
        mipsolver.model_->offset_;
    bool feasible = mipsolver.bound_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.integrality_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance &&
                    mipsolver.row_violation_ <=
                        mipsolver.options_mip_->mip_feasibility_tolerance;
    if (numRestarts == 0) {
      highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                   "\nMIP start solution is %s, objective value is %.12g\n",
                   feasible ? "feasible" : "infeasible",
                   mipsolver.solution_objective_);
    }
    if (feasible && solobj < upper_bound) {
      double prev_upper_bound = upper_bound;

      upper_bound = solobj;

      bool bound_change = upper_bound != prev_upper_bound;
      if (!mipsolver.submip && bound_change)
        updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                                 upper_bound);

      double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);
      saveReportMipSolution(new_upper_limit);
      if (new_upper_limit < upper_limit) {
        upper_limit = new_upper_limit;
        optimality_limit =
            computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                                 mipsolver.options_mip_->mip_rel_gap);
        nodequeue.setOptimalityLimit(optimality_limit);
      }
    }
    if (!mipsolver.submip && feasible && mipsolver.callback_->user_callback &&
        mipsolver.callback_->active[kCallbackMipSolution]) {
      assert(!mipsolver.submip);
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipSolution, mipsolver.solution_objective_,
          "Feasible solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.numCol() == 0)
    addIncumbent(std::vector<double>(), 0, kSolutionSourceEmptyMip);

  redcostfixing = HighsRedcostFixing();
  pseudocost = HighsPseudocost(mipsolver);
  nodequeue.setNumCol(mipsolver.numCol());
  nodequeue.setOptimalityLimit(optimality_limit);

  continuous_cols.clear();
  integer_cols.clear();
  implint_cols.clear();
  integral_cols.clear();

  rowMatrixSet = false;
  if (!rowMatrixSet) {
    rowMatrixSet = true;
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart_, ARindex_, ARvalue_);
    // (re-)initialize number of uplocks and downlocks
    uplocks.assign(model.num_col_, 0);
    downlocks.assign(model.num_col_, 0);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      HighsInt start = model.a_matrix_.start_[i];
      HighsInt end = model.a_matrix_.start_[i + 1];
      for (HighsInt j = start; j != end; ++j) {
        HighsInt row = model.a_matrix_.index_[j];

        if (model.row_lower_[row] != -kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++uplocks[i];
          else
            ++downlocks[i];
        }
        if (model.row_upper_[row] != kHighsInf) {
          if (model.a_matrix_.value_[j] < 0)
            ++downlocks[i];
          else
            ++uplocks[i];
        }
      }
    }
  }

  rowintegral.resize(mipsolver.model_->num_row_);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    bool integral = true;
    for (HighsInt j = start; j != end; ++j) {
      integral =
          integral &&
          mipsolver.variableType(ARindex_[j]) != HighsVarType::kContinuous &&
          fractionality(ARvalue_[j]) <= epsilon;

      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));
    }

    if (integral) {
      if (presolvedModel.row_lower_[i] != -kHighsInf)
        presolvedModel.row_lower_[i] =
            std::ceil(presolvedModel.row_lower_[i] - feastol);

      if (presolvedModel.row_upper_[i] != kHighsInf)
        presolvedModel.row_upper_[i] =
            std::floor(presolvedModel.row_upper_[i] + feastol);
    }

    rowintegral[i] = integral;
    maxAbsRowCoef[i] = maxabsval;
  }

  // compute row activities and propagate all rows once
  objectiveFunction.setupCliquePartition(domain, cliquetable);
  domain.setupObjectivePropagation();
  domain.computeRowActivities();
  domain.propagate();
  if (domain.infeasible()) {
    mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

    double prev_lower_bound = lower_bound;

    lower_bound = kHighsInf;

    bool bound_change = lower_bound != prev_lower_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);

    pruned_treeweight = 1.0;
    return;
  }

  if (model.num_col_ == 0) {
    mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }

  if (checkLimits()) return;
  // extract cliques if they have not been extracted before

  for (HighsInt col : domain.getChangedCols())
    implications.cleanupVarbounds(col);
  domain.clearChangedCols();

  lp.getLpSolver().setOptionValue("presolve", kHighsOffString);
  // lp.getLpSolver().setOptionValue("dual_simplex_cost_perturbation_multiplier",
  // 0.0); lp.getLpSolver().setOptionValue("parallel", kHighsOnString);
  lp.getLpSolver().setOptionValue("simplex_initial_condition_check", false);

  checkObjIntegrality();
  rootlpsol.clear();
  firstlpsol.clear();
  HighsInt numBin = 0;

  maxTreeSizeLog2 = 0;
  for (HighsInt i = 0; i != mipsolver.numCol(); ++i) {
    switch (mipsolver.variableType(i)) {
      case HighsVarType::kContinuous:
        if (domain.isFixed(i)) continue;
        continuous_cols.push_back(i);
        break;
      case HighsVarType::kImplicitInteger:
        if (domain.isFixed(i)) continue;
        implint_cols.push_back(i);
        integral_cols.push_back(i);
        break;
      case HighsVarType::kInteger:
        if (domain.isFixed(i)) {
          if (fractionality(domain.col_lower_[i]) > feastol) {
            // integer variable is fixed to a fractional value -> infeasible
            mipsolver.modelstatus_ = HighsModelStatus::kInfeasible;

            double prev_lower_bound = lower_bound;

            lower_bound = kHighsInf;

            bool bound_change = lower_bound != prev_lower_bound;
            if (!mipsolver.submip && bound_change)
              updatePrimalDualIntegral(prev_lower_bound, lower_bound,
                                       upper_bound, upper_bound);

            pruned_treeweight = 1.0;
            return;
          }
          continue;
        }
        integer_cols.push_back(i);
        integral_cols.push_back(i);
        maxTreeSizeLog2 += (HighsInt)std::ceil(
            std::log2(std::min(1024.0, 1.0 + mipsolver.model_->col_upper_[i] -
                                           mipsolver.model_->col_lower_[i])));
        // NB Since this is for counting the number of times the
        // condition is true using the bitwise operator avoids having
        // any conditional branch whereas using the logical operator
        // would require a branch due to short circuit
        // evaluation. Semantically both is equivalent and correct. If
        // there was any code to be executed for the condition being
        // true then there would be a conditional branch in any case
        // and I would have used the logical to begin with.
        //
        // Hence any compiler warning can be ignored safely
        numBin +=
            (static_cast<HighsInt>(mipsolver.model_->col_lower_[i] == 0.0) &
             static_cast<HighsInt>(mipsolver.model_->col_upper_[i] == 1.0));
        break;
      case HighsVarType::kSemiContinuous:
      case HighsVarType::kSemiInteger:
        highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kError,
                     "Semicontinuous or semiinteger variables should have been "
                     "reformulated away before HighsMipSolverData::runSetup() "
                     "is called.");
        throw std::logic_error("Unexpected variable type");
    }
  }

  basisTransfer();

  numintegercols = integer_cols.size();
  detectSymmetries = detectSymmetries && numBin > 0;
  numCliqueEntriesAfterPresolve = cliquetable.getNumEntries();

  if (numRestarts == 0) {
    numCliqueEntriesAfterFirstPresolve = cliquetable.getNumEntries();
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
               "\nSolving MIP model with:\n"
               "   %" HIGHSINT_FORMAT " rows\n"
               "   %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT" binary, %" HIGHSINT_FORMAT " integer, %" HIGHSINT_FORMAT" implied int., %" HIGHSINT_FORMAT " continuous)\n"
               "   %" HIGHSINT_FORMAT " nonzeros\n",
                 // clang-format on
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  } else {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Model after restart has %" HIGHSINT_FORMAT
                 " rows, %" HIGHSINT_FORMAT " cols (%" HIGHSINT_FORMAT
                 " bin., %" HIGHSINT_FORMAT " int., %" HIGHSINT_FORMAT
                 " impl., %" HIGHSINT_FORMAT " cont.), and %" HIGHSINT_FORMAT
                 " nonzeros\n",
                 mipsolver.numRow(), mipsolver.numCol(), numBin,
                 numintegercols - numBin, (HighsInt)implint_cols.size(),
                 (HighsInt)continuous_cols.size(), mipsolver.numNonzero());
  }

  heuristics.setupIntCols();

#ifdef HIGHS_DEBUGSOL
  if (numRestarts == 0) {
    debugSolution.activate();
    assert(!debugSolution.debugSolActive ||
           checkSolution(debugSolution.debugSolution));
  }
#endif

  if (upper_limit == kHighsInf) analyticCenterComputed = false;
  analyticCenterStatus = HighsModelStatus::kNotset;
  analyticCenter.clear();

  symmetries.clear();

  if (numRestarts != 0)
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "\n");
}